

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oplintf.c
# Opt level: O3

UINT8 device_start_ym3526(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint clock;
  UINT8 UVar1;
  DEV_DATA DVar2;
  uint rate;
  
  clock = cfg->clock;
  if (cfg->srMode == '\x02') {
    rate = cfg->smplRate;
    if (cfg->smplRate < clock / 0x48) {
      rate = clock / 0x48;
    }
  }
  else {
    rate = clock / 0x48;
    if (cfg->srMode == '\x01') {
      rate = cfg->smplRate;
    }
  }
  DVar2.chipInf = ym3526_init(clock,rate);
  if (DVar2.chipInf == (void *)0x0) {
    UVar1 = 0xff;
  }
  else {
    *(void **)DVar2.chipInf = DVar2.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = rate;
    retDevInf->devDef = &devDef3526_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

static UINT8 device_start_ym3526(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = ym3526_init(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	// YM3526 setup
	//ym3526_set_timer_handler (chip, TimerHandler, chip);
	//ym3526_set_irq_handler   (chip, IRQHandler, chip);
	//ym3526_set_update_handler(chip, stream_update3526, chip);
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef3526_MAME);
	return 0x00;
}